

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,EnumDescriptorProto *proto,LocationRecorder *enum_location)

{
  bool bVar1;
  Token *pTVar2;
  undefined1 local_e8 [8];
  LocationRecorder location_2;
  LocationRecorder location_1;
  undefined1 local_a8 [8];
  LocationRecorder location;
  string_view local_70;
  undefined1 local_60 [8];
  Token start_token;
  LocationRecorder *enum_location_local;
  EnumDescriptorProto *proto_local;
  Parser *this_local;
  
  start_token._48_8_ = enum_location;
  pTVar2 = io::Tokenizer::current(this->input_);
  io::Tokenizer::Token::Token((Token *)local_60,pTVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_70,"reserved");
  bVar1 = Consume(this,local_70);
  if (bVar1) {
    bVar1 = LookingAtType(this,TYPE_STRING);
    if (bVar1) {
      bVar1 = std::operator==(&this->syntax_identifier_,"editions");
      if (bVar1) {
        ErrorMaker::ErrorMaker
                  ((ErrorMaker *)&location.location_,
                   "Reserved names must be identifiers in editions, not string literals.");
        RecordError(this,stack0xffffffffffffff70);
        this_local._7_1_ = false;
      }
      else {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_a8,(LocationRecorder *)start_token._48_8_,5);
        LocationRecorder::StartAt((LocationRecorder *)local_a8,(Token *)local_60);
        this_local._7_1_ = ParseReservedNames(this,proto,(LocationRecorder *)local_a8);
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_a8);
      }
    }
    else {
      bVar1 = LookingAtType(this,TYPE_IDENTIFIER);
      if (bVar1) {
        bVar1 = std::operator!=(&this->syntax_identifier_,"editions");
        if (bVar1) {
          ErrorMaker::ErrorMaker
                    ((ErrorMaker *)&location_1.location_,
                     "Reserved names must be string literals. (Only editions supports identifiers.)"
                    );
          RecordError(this,stack0xffffffffffffff48);
          this_local._7_1_ = false;
        }
        else {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)&location_2.location_,
                     (LocationRecorder *)start_token._48_8_,5);
          LocationRecorder::StartAt((LocationRecorder *)&location_2.location_,(Token *)local_60);
          this_local._7_1_ =
               ParseReservedIdentifiers(this,proto,(LocationRecorder *)&location_2.location_);
          LocationRecorder::~LocationRecorder((LocationRecorder *)&location_2.location_);
        }
      }
      else {
        LocationRecorder::LocationRecorder
                  ((LocationRecorder *)local_e8,(LocationRecorder *)start_token._48_8_,4);
        LocationRecorder::StartAt((LocationRecorder *)local_e8,(Token *)local_60);
        this_local._7_1_ = ParseReservedNumbers(this,proto,(LocationRecorder *)local_e8);
        LocationRecorder::~LocationRecorder((LocationRecorder *)local_e8);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  io::Tokenizer::Token::~Token((Token *)local_60);
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseReserved(EnumDescriptorProto* proto,
                           const LocationRecorder& enum_location) {
  io::Tokenizer::Token start_token = input_->current();
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    if (syntax_identifier_ == "editions") {
      RecordError(
          "Reserved names must be identifiers in editions, not string "
          "literals.");
      return false;
    }
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNames(proto, location);
  } else if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    if (syntax_identifier_ != "editions") {
      RecordError(
          "Reserved names must be string literals. (Only editions supports "
          "identifiers.)");
      return false;
    }
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedIdentifiers(proto, location);
  } else {
    LocationRecorder location(enum_location,
                              EnumDescriptorProto::kReservedRangeFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNumbers(proto, location);
  }
}